

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

_Bool jsondec_seqnext(jsondec *d,char end_ch)

{
  _Bool _Var1;
  _Bool is_first;
  char end_ch_local;
  jsondec *d_local;
  
  _Var1 = d->is_first;
  d->is_first = false;
  jsondec_skipws(d);
  if (*d->ptr == end_ch) {
    d_local._7_1_ = false;
  }
  else {
    if ((_Var1 & 1U) == 0) {
      jsondec_parselit(d,",");
    }
    d_local._7_1_ = true;
  }
  return d_local._7_1_;
}

Assistant:

static bool jsondec_seqnext(jsondec* d, char end_ch) {
  bool is_first = d->is_first;
  d->is_first = false;
  jsondec_skipws(d);
  if (*d->ptr == end_ch) return false;
  if (!is_first) jsondec_parselit(d, ",");
  return true;
}